

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::AddEntryPointToEntryPointList
          (FunctionBody *this,FunctionEntryPointInfo *entryPointInfo)

{
  int iVar1;
  ThreadContext *threadContext;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *this_00;
  RecyclerWeakReference<Js::FunctionEntryPointInfo> *local_48 [3];
  Recycler *local_30;
  Recycler *recycler;
  AutoDisableExpiration disableExpiration;
  FunctionEntryPointInfo *entryPointInfo_local;
  FunctionBody *this_local;
  
  disableExpiration._8_8_ = entryPointInfo;
  threadContext =
       ScriptContext::GetThreadContext
                 ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  ThreadContext::AutoDisableExpiration::AutoDisableExpiration
            ((AutoDisableExpiration *)&recycler,threadContext);
  local_30 = ScriptContext::GetRecycler
                       ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  this_00 = Memory::
            WriteBarrierPtr<Js::SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>_>
            ::operator->(&this->entryPoints);
  local_48[0] = Memory::Recycler::CreateWeakReferenceHandle<Js::FunctionEntryPointInfo>
                          (local_30,(FunctionEntryPointInfo *)disableExpiration._8_8_);
  iVar1 = SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
          ::Add(this_00,local_48);
  *(int *)(disableExpiration._8_8_ + 0x78) = iVar1;
  ThreadContext::AutoDisableExpiration::~AutoDisableExpiration((AutoDisableExpiration *)&recycler);
  return;
}

Assistant:

void FunctionBody::AddEntryPointToEntryPointList(FunctionEntryPointInfo* entryPointInfo)
    {
        ThreadContext::AutoDisableExpiration disableExpiration(this->m_scriptContext->GetThreadContext());

        Recycler* recycler = this->m_scriptContext->GetRecycler();
        entryPointInfo->entryPointIndex = this->entryPoints->Add(recycler->CreateWeakReferenceHandle(entryPointInfo));
    }